

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderEditor.cpp
# Opt level: O3

void __thiscall OrderEditor::addActionsToToolbar(OrderEditor *this,Actions *actions)

{
  QAction *pQVar1;
  reference ppQVar2;
  QList<QAction_*> local_30;
  
  QWidget::actions();
  ppQVar2 = QList<QAction_*>::operator[](&local_30,0);
  pQVar1 = *ppQVar2;
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,8,8);
    }
  }
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QToolBar::insertSeparator((QAction *)this->mToolbar);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QToolBar::insertSeparator((QAction *)this->mToolbar);
  return;
}

Assistant:

void OrderEditor::addActionsToToolbar(Actions const& actions) {
    auto head = mToolbar->actions()[0];
    mToolbar->insertAction(head, actions.add);
    mToolbar->insertAction(head, actions.remove);
    mToolbar->insertAction(head, actions.duplicate);
    mToolbar->insertSeparator(head);
    mToolbar->insertAction(head, actions.moveUp);
    mToolbar->insertAction(head, actions.moveDown);
    mToolbar->insertSeparator(head);
}